

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O3

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,string *name,
          bool param_2,cmake *cm)

{
  cmGlobalUnixMakefileGenerator3 *this_00;
  undefined7 in_register_00000011;
  cmake *in_R8;
  
  if ((*(long *)(CONCAT71(in_register_00000011,param_2) + 8) == 0xe) &&
     (*(long *)((long)*(long **)CONCAT71(in_register_00000011,param_2) + 6) == 0x73656c6966656b61 &&
      **(long **)CONCAT71(in_register_00000011,param_2) == 0x6b614d2078696e55)) {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x7e0);
    cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_00,in_R8);
  }
  else {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)0x0;
  }
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }